

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O1

GCcdata * lj_cdata_newv(lua_State *L,CTypeID id,CTSize sz,CTSize align)

{
  GCcdata *pGVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  iVar4 = 1 << ((byte)align & 0x1f);
  iVar6 = 0x10;
  if (3 < align) {
    iVar6 = iVar4 + 8;
  }
  pvVar2 = lj_mem_realloc(L,(void *)0x0,0,sz + iVar6);
  uVar3 = (ulong)(iVar4 - 1);
  uVar5 = ~uVar3 & (long)pvVar2 + uVar3 + 0x10;
  pGVar1 = (GCcdata *)(uVar5 - 8);
  *(short *)(uVar5 - 0x10) = (short)pGVar1 - (short)pvVar2;
  *(short *)(uVar5 - 0xe) = (short)iVar6;
  *(CTSize *)(uVar5 - 0xc) = sz;
  uVar3 = (ulong)(L->glref).ptr32;
  *(undefined4 *)(uVar5 - 8) = *(undefined4 *)(uVar3 + 0x60);
  *(int *)(uVar3 + 0x60) = (int)pGVar1;
  *(byte *)(uVar5 - 4) = *(byte *)(uVar3 + 0x58) & 3 | 0x80;
  *(undefined1 *)(uVar5 - 3) = 10;
  *(short *)(uVar5 - 2) = (short)id;
  *(long *)(uVar3 + 0xe0) = *(long *)(uVar3 + 0xe0) + 1;
  return pGVar1;
}

Assistant:

GCcdata *lj_cdata_newv(lua_State *L, CTypeID id, CTSize sz, CTSize align)
{
  global_State *g;
  MSize extra = sizeof(GCcdataVar) + sizeof(GCcdata) +
		(align > CT_MEMALIGN ? (1u<<align) - (1u<<CT_MEMALIGN) : 0);
  char *p = lj_mem_newt(L, extra + sz, char);
  uintptr_t adata = (uintptr_t)p + sizeof(GCcdataVar) + sizeof(GCcdata);
  uintptr_t almask = (1u << align) - 1u;
  GCcdata *cd = (GCcdata *)(((adata + almask) & ~almask) - sizeof(GCcdata));
  lj_assertL((char *)cd - p < 65536, "excessive cdata alignment");
  cdatav(cd)->offset = (uint16_t)((char *)cd - p);
  cdatav(cd)->extra = extra;
  cdatav(cd)->len = sz;
  g = G(L);
  setgcrefr(cd->nextgc, g->gc.root);
  setgcref(g->gc.root, obj2gco(cd));
  newwhite(g, obj2gco(cd));
  cd->marked |= 0x80;
  cd->gct = ~LJ_TCDATA;
  cd->ctypeid = id;
  g->gc.cdatanum++;
  return cd;
}